

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O0

void Parser::MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitCatch(ParseNodeCatch*)::__0>
               (ParseNodePtr elementNode,anon_class_24_3_b926b611 handler)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeBin *pPVar3;
  ParseNodeUni *pPVar4;
  undefined4 *puVar5;
  ParseNode *local_18;
  ParseNodePtr bindIdentNode;
  ParseNodePtr elementNode_local;
  
  if (elementNode->nop == knopAsg) {
    pPVar3 = ParseNode::AsParseNodeBin(elementNode);
    local_18 = pPVar3->pnode1;
  }
  else {
    local_18 = elementNode;
    if (elementNode->nop == knopEllipsis) {
      pPVar4 = ParseNode::AsParseNodeUni(elementNode);
      local_18 = pPVar4->pnode1;
    }
  }
  bVar2 = ParseNode::IsPattern(local_18);
  if (bVar2) {
    MapBindIdentifier<ByteCodeGenerator::StartEmitCatch(ParseNodeCatch*)::__0>(local_18,handler);
  }
  else {
    bVar2 = ParseNode::IsVarLetOrConst(local_18);
    if (bVar2) {
      ByteCodeGenerator::StartEmitCatch::anon_class_24_3_b926b611::operator()(&handler,local_18);
    }
    else if (local_18->nop != knopEmpty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                         ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }